

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O0

bool chaiscript::dispatch::detail::
     compare_types_cast<void,chaiscript::dispatch::Assignable_Proxy_Function&,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&,0ul,1ul>
               (undefined8 param_1,
               vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *param_2)

{
  bad_boxed_cast *anon_var_0;
  Type_Conversions_State *in_stack_000000a0;
  Boxed_Value *in_stack_000000a8;
  Type_Conversions_State *in_stack_000000b0;
  Boxed_Value *in_stack_000000b8;
  
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::operator[]
            (param_2,0);
  boxed_cast<chaiscript::dispatch::Assignable_Proxy_Function&>(in_stack_000000b8,in_stack_000000b0);
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::operator[]
            (param_2,1);
  boxed_cast<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&>
            (in_stack_000000a8,in_stack_000000a0);
  std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base> *)0x3bc33b);
  return true;
}

Assistant:

bool compare_types_cast(Indexes<I...>, Ret (*)(Params...),
             const std::vector<Boxed_Value> &params, const Type_Conversions_State &t_conversions)
        {
          try {
            (void)params; (void)t_conversions;
            (void)std::initializer_list<int>{(boxed_cast<Params>(params[I], &t_conversions), 0)...};
            return true;
          } catch (const exception::bad_boxed_cast &) {
            return false;
          }

        }